

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O3

bool Omega_h::inertia::anon_unknown_0::mark_axis_bisection
               (CommPtr *comm,Reals *distances,Reals *masses,Real total_mass,Real tolerance,
               Read<signed_char> *marked)

{
  int *piVar1;
  void *pvVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Reals *pRVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  IntIterator last_1;
  int iVar10;
  Alloc *pAVar11;
  size_t sVar12;
  IntIterator last;
  Alloc *pAVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar15;
  ulong in_XMM1_Qb;
  MinMax<double> MVar16;
  type f;
  Write<double> weighted;
  Write<signed_char> marked_1;
  type f_1;
  bool local_1a1;
  undefined1 local_1a0 [32];
  Alloc *local_180;
  void *local_178;
  Real local_170;
  Write<double> local_168;
  undefined1 local_158 [16];
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  Write<signed_char> local_138;
  Alloc *local_128;
  void *pvStack_120;
  Alloc *local_118;
  void *pvStack_110;
  double local_108;
  ulong uStack_100;
  CommPtr *local_f0;
  ulong local_e8;
  Write<double> local_e0;
  Write<signed_char> local_d0;
  Alloc *local_c0;
  void *local_b8;
  Alloc *local_b0;
  void *local_a8;
  Alloc *local_a0;
  void *local_98;
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  void *local_78;
  Read<double> local_70;
  CommPtr local_60;
  Real local_50;
  Reals *local_48;
  Read<signed_char> *local_40;
  Reals *local_38;
  
  local_158._8_8_ = local_158._0_8_;
  local_70.write_.shared_alloc_.alloc = (distances->write_).shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 1) == 0) {
    uVar8 = (local_70.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar8 = (ulong)local_70.write_.shared_alloc_.alloc >> 3;
  }
  pAVar11 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar11 & 1) == 0) {
    sVar12 = pAVar11->size;
  }
  else {
    sVar12 = (ulong)pAVar11 >> 3;
  }
  local_f0 = comm;
  local_50 = tolerance;
  if ((int)(uVar8 >> 3) == (int)(sVar12 >> 3)) {
    local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        local_70.write_.shared_alloc_.alloc = (distances->write_).shared_alloc_.alloc;
      }
      else {
        (local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70.write_.shared_alloc_.alloc =
             (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_70.write_.shared_alloc_.alloc)->use_count =
             (local_70.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_70.write_.shared_alloc_.direct_ptr = (distances->write_).shared_alloc_.direct_ptr;
    local_170 = total_mass;
    MVar16 = get_minmax<double>(&local_60,&local_70);
    pAVar11 = local_70.write_.shared_alloc_.alloc;
    local_108 = MVar16.max;
    local_158._0_4_ = MVar16.min._0_4_;
    local_158._4_4_ = MVar16.min._4_4_;
    uVar14 = extraout_XMM0_Dc;
    uVar15 = extraout_XMM0_Dd;
    uStack_100 = in_XMM1_Qb;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      uVar14 = extraout_XMM0_Dc;
      uVar15 = extraout_XMM0_Dd;
      if (*piVar1 == 0) {
        local_158._8_4_ = extraout_XMM0_Dc;
        local_158._0_8_ = MVar16.min;
        local_158._12_4_ = extraout_XMM0_Dd;
        Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
        operator_delete(pAVar11,0x48);
        uVar5 = local_158._8_8_;
        uVar14 = local_158._8_4_;
        uVar15 = local_158._12_4_;
        local_158._8_8_ = uVar5;
      }
    }
    local_38 = masses;
    if (local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_158._8_4_ = uVar14;
      local_158._12_4_ = uVar15;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_108 = ABS(local_108);
    uStack_100 = uStack_100 & 0x7fffffffffffffff;
    if (local_108 <= ABS((double)CONCAT44(local_158._4_4_,local_158._0_4_))) {
      local_108 = ABS((double)CONCAT44(local_158._4_4_,local_158._0_4_));
    }
    local_170 = local_170 * 0.5;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_158._8_8_;
    local_158 = auVar4 << 0x40;
    local_e8 = 0;
    local_1a1 = true;
    local_48 = distances;
    local_40 = marked;
    while( true ) {
      local_108 = local_108 * 0.5;
      local_80 = (distances->write_).shared_alloc_.alloc;
      if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_80 = (Alloc *)(local_80->size * 8 + 1);
        }
        else {
          local_80->use_count = local_80->use_count + 1;
        }
      }
      pAVar11 = local_80;
      pvVar2 = (distances->write_).shared_alloc_.direct_ptr;
      if (((ulong)local_80 & 1) == 0) {
        sVar12 = local_80->size;
      }
      else {
        sVar12 = (ulong)local_80 >> 3;
      }
      local_1a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a0._16_8_ = local_1a0._16_8_ & 0xffffffffffffff00;
      iVar10 = (int)(sVar12 >> 3);
      local_1a0._0_8_ = local_1a0 + 0x10;
      local_78 = pvVar2;
      Write<signed_char>::Write(&local_138,iVar10,(string *)local_1a0);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      local_1a0._0_8_ = local_138.shared_alloc_.alloc;
      if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
          local_138.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1a0._0_8_ = (local_138.shared_alloc_.alloc)->size * 8 + 1;
        }
        else {
          (local_138.shared_alloc_.alloc)->use_count =
               (local_138.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_1a0._8_8_ = local_138.shared_alloc_.direct_ptr;
      local_1a0._16_8_ = pAVar11;
      if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1a0._16_8_ = (Alloc *)(pAVar11->size * 8 + 1);
        }
        else {
          pAVar11->use_count = pAVar11->use_count + 1;
        }
      }
      local_180 = (Alloc *)local_158._0_8_;
      pAVar11 = (Alloc *)local_1a0._0_8_;
      if ((local_1a0._0_8_ & 7) == 0 && (Alloc *)local_1a0._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          pAVar11 = (Alloc *)(*(long *)local_1a0._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_1a0._0_8_ + 0x30) = *(int *)(local_1a0._0_8_ + 0x30) + 1;
        }
      }
      pAVar13 = (Alloc *)local_1a0._16_8_;
      if ((local_1a0._16_8_ & 7) == 0 && (Alloc *)local_1a0._16_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          pAVar13 = (Alloc *)(*(long *)local_1a0._16_8_ * 8 + 1);
        }
        else {
          *(int *)(local_1a0._16_8_ + 0x30) = *(int *)(local_1a0._16_8_ + 0x30) + 1;
        }
      }
      if (0 < iVar10) {
        if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
          pAVar11->use_count = pAVar11->use_count + -1;
          pAVar11 = (Alloc *)(pAVar11->size * 8 + 1);
        }
        if (((ulong)pAVar13 & 7) == 0 && pAVar13 != (Alloc *)0x0) {
          pAVar13->use_count = pAVar13->use_count + -1;
          pAVar13 = (Alloc *)(pAVar13->size * 8 + 1);
        }
        entering_parallel = '\0';
        lVar9 = 0;
        do {
          *(bool *)((long)(_func_int ***)local_138.shared_alloc_.direct_ptr + lVar9) =
               (double)local_158._0_8_ < *(double *)((long)pvVar2 + lVar9 * 8);
          lVar9 = lVar9 + 1;
        } while (iVar10 != (int)lVar9);
      }
      local_1a0._24_8_ = pvVar2;
      if (((ulong)pAVar13 & 7) == 0 && pAVar13 != (Alloc *)0x0) {
        piVar1 = &pAVar13->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar13);
          operator_delete(pAVar13,0x48);
        }
      }
      if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
        piVar1 = &pAVar11->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar11);
          operator_delete(pAVar11,0x48);
        }
      }
      pRVar6 = local_38;
      local_d0.shared_alloc_.alloc = local_138.shared_alloc_.alloc;
      local_d0.shared_alloc_.direct_ptr = local_138.shared_alloc_.direct_ptr;
      if ((((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
           local_138.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_138.shared_alloc_.alloc)->use_count = (local_138.shared_alloc_.alloc)->use_count + -1
        ;
        local_d0.shared_alloc_.alloc = (Alloc *)((local_138.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_138.shared_alloc_.alloc = (Alloc *)0x0;
      local_138.shared_alloc_.direct_ptr = (void *)0x0;
      Read<signed_char>::Read((Read<signed_char> *)&local_168,&local_d0);
      pAVar11 = local_d0.shared_alloc_.alloc;
      if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 &&
          local_d0.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_d0.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_d0.shared_alloc_.alloc);
          operator_delete(pAVar11,0x48);
        }
      }
      uVar5 = local_1a0._16_8_;
      if ((local_1a0._16_8_ & 7) == 0 && (Alloc *)local_1a0._16_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_1a0._16_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_1a0._16_8_);
          operator_delete((void *)uVar5,0x48);
        }
      }
      uVar5 = local_1a0._0_8_;
      if ((local_1a0._0_8_ & 7) == 0 && (Alloc *)local_1a0._0_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_1a0._0_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_1a0._0_8_);
          operator_delete((void *)uVar5,0x48);
        }
      }
      pAVar11 = local_138.shared_alloc_.alloc;
      if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
          local_138.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_138.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_138.shared_alloc_.alloc);
          operator_delete(pAVar11,0x48);
        }
      }
      pAVar11 = (marked->write_).shared_alloc_.alloc;
      if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
        piVar1 = &pAVar11->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar11);
          operator_delete(pAVar11,0x48);
        }
      }
      pAVar11 = local_80;
      (marked->write_).shared_alloc_.alloc = local_168.shared_alloc_.alloc;
      (marked->write_).shared_alloc_.direct_ptr = local_168.shared_alloc_.direct_ptr;
      if ((((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
           local_168.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_168.shared_alloc_.alloc)->use_count = (local_168.shared_alloc_.alloc)->use_count + -1
        ;
        (marked->write_).shared_alloc_.alloc =
             (Alloc *)((local_168.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_168.shared_alloc_.alloc = (Alloc *)0x0;
      local_168.shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
        piVar1 = &local_80->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_80);
          operator_delete(pAVar11,0x48);
        }
      }
      local_148 = (local_f0->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_140 = (local_f0->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
      if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_140->_M_use_count = local_140->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_140->_M_use_count = local_140->_M_use_count + 1;
        }
      }
      local_90 = (pRVar6->write_).shared_alloc_.alloc;
      if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_90 = (Alloc *)(local_90->size * 8 + 1);
        }
        else {
          local_90->use_count = local_90->use_count + 1;
        }
      }
      pAVar11 = local_90;
      pvVar2 = (pRVar6->write_).shared_alloc_.direct_ptr;
      local_a0 = (marked->write_).shared_alloc_.alloc;
      if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a0 = (Alloc *)(local_a0->size * 8 + 1);
        }
        else {
          local_a0->use_count = local_a0->use_count + 1;
        }
      }
      pAVar13 = local_a0;
      pvVar3 = (marked->write_).shared_alloc_.direct_ptr;
      if (((ulong)local_90 & 1) == 0) {
        sVar12 = local_90->size;
      }
      else {
        sVar12 = (ulong)local_90 >> 3;
      }
      local_1a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a0._16_8_ = local_1a0._16_8_ & 0xffffffffffffff00;
      iVar10 = (int)(sVar12 >> 3);
      local_1a0._0_8_ = (Alloc *)(local_1a0 + 0x10);
      local_98 = pvVar3;
      local_88 = pvVar2;
      Write<double>::Write(&local_168,iVar10,(string *)local_1a0);
      if ((Alloc *)local_1a0._0_8_ != (Alloc *)(local_1a0 + 0x10)) {
        operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
      }
      this = local_140;
      local_d0.shared_alloc_.alloc = local_168.shared_alloc_.alloc;
      if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
          local_168.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d0.shared_alloc_.alloc = (Alloc *)((local_168.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_168.shared_alloc_.alloc)->use_count =
               (local_168.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_d0.shared_alloc_.direct_ptr = local_168.shared_alloc_.direct_ptr;
      local_c0 = pAVar13;
      if (((ulong)pAVar13 & 7) == 0 && pAVar13 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c0 = (Alloc *)(pAVar13->size * 8 + 1);
        }
        else {
          pAVar13->use_count = pAVar13->use_count + 1;
        }
      }
      local_b0 = pAVar11;
      if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b0 = (Alloc *)(pAVar11->size * 8 + 1);
        }
        else {
          pAVar11->use_count = pAVar11->use_count + 1;
        }
      }
      local_138.shared_alloc_.alloc = local_d0.shared_alloc_.alloc;
      if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 &&
          local_d0.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_138.shared_alloc_.alloc = (Alloc *)((local_d0.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_d0.shared_alloc_.alloc)->use_count = (local_d0.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_138.shared_alloc_.direct_ptr = local_168.shared_alloc_.direct_ptr;
      local_128 = local_c0;
      if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_128 = (Alloc *)(local_c0->size * 8 + 1);
        }
        else {
          local_c0->use_count = local_c0->use_count + 1;
        }
      }
      local_118 = local_b0;
      if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_118 = (Alloc *)(local_b0->size * 8 + 1);
        }
        else {
          local_b0->use_count = local_b0->use_count + 1;
        }
      }
      pvStack_120 = pvVar3;
      pvStack_110 = pvVar2;
      local_b8 = pvVar3;
      local_a8 = pvVar2;
      if (0 < iVar10) {
        local_1a0._8_8_ = local_168.shared_alloc_.direct_ptr;
        local_1a0._0_8_ = local_138.shared_alloc_.alloc;
        if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
            local_138.shared_alloc_.alloc != (Alloc *)0x0) {
          (local_138.shared_alloc_.alloc)->use_count =
               (local_138.shared_alloc_.alloc)->use_count + -1;
          local_1a0._0_8_ = (local_138.shared_alloc_.alloc)->size * 8 + 1;
        }
        local_138.shared_alloc_.alloc = (Alloc *)0x0;
        local_138.shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1a0._16_8_ = local_128;
        if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
          local_128->use_count = local_128->use_count + -1;
          local_1a0._16_8_ = local_128->size * 8 + 1;
        }
        local_128 = (Alloc *)0x0;
        pvStack_120 = (void *)0x0;
        local_180 = local_118;
        if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
          local_118->use_count = local_118->use_count + -1;
          local_180 = (Alloc *)(local_118->size * 8 + 1);
        }
        local_118 = (Alloc *)0x0;
        pvStack_110 = (void *)0x0;
        entering_parallel = '\0';
        lVar9 = 0;
        do {
          ((_func_int ***)local_168.shared_alloc_.direct_ptr)[lVar9] =
               (_func_int **)
               ((double)(int)*(char *)((long)pvVar3 + lVar9) * *(double *)((long)pvVar2 + lVar9 * 8)
               );
          lVar9 = lVar9 + 1;
        } while (iVar10 != (int)lVar9);
        local_1a0._24_8_ = pvVar3;
        local_178 = pvVar2;
        (anonymous_namespace)::
        get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
        ::$_0::~__0((__0 *)local_1a0);
      }
      (anonymous_namespace)::
      get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
      ::$_0::~__0((__0 *)&local_138);
      marked = local_40;
      distances = local_48;
      local_1a0._0_8_ = local_148;
      local_1a0._8_8_ = this;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_e0.shared_alloc_.alloc = local_168.shared_alloc_.alloc;
      if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
          local_168.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_e0.shared_alloc_.alloc = (Alloc *)((local_168.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_168.shared_alloc_.alloc)->use_count =
               (local_168.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_e0.shared_alloc_.direct_ptr = local_168.shared_alloc_.direct_ptr;
      Read<double>::Read((Read<signed_char> *)&local_138,&local_e0);
      local_148 = (element_type *)repro_sum((CommPtr *)local_1a0,(Reals *)&local_138);
      pAVar11 = local_138.shared_alloc_.alloc;
      if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
          local_138.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_138.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_138.shared_alloc_.alloc);
          operator_delete(pAVar11,0x48);
        }
      }
      pAVar11 = local_e0.shared_alloc_.alloc;
      if (((ulong)local_e0.shared_alloc_.alloc & 7) == 0 &&
          local_e0.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_e0.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_e0.shared_alloc_.alloc);
          operator_delete(pAVar11,0x48);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
      }
      (anonymous_namespace)::
      get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)
      ::$_0::~__0((__0 *)&local_d0);
      pAVar11 = local_168.shared_alloc_.alloc;
      if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
          local_168.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_168.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_168.shared_alloc_.alloc);
          operator_delete(pAVar11,0x48);
        }
      }
      pAVar11 = local_a0;
      if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
        piVar1 = &local_a0->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_a0);
          operator_delete(pAVar11,0x48);
        }
      }
      pAVar11 = local_90;
      if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
        piVar1 = &local_90->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_90);
          operator_delete(pAVar11,0x48);
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (ABS((double)local_148 - local_170) <= local_50) break;
      local_158._0_8_ =
           (double)local_158._0_8_ +
           (double)(~-(ulong)(local_170 < (double)local_148) & (ulong)-local_108 |
                   -(ulong)(local_170 < (double)local_148) & (ulong)local_108);
      local_1a1 = (uint)local_e8 < 0x33;
      uVar7 = (uint)local_e8 + 1;
      local_e8 = (ulong)uVar7;
      if (uVar7 == 0x34) {
        return local_1a1;
      }
    }
    return local_1a1;
  }
  fail("assertion %s failed at %s +%d\n","n == masses.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
       ,0x5c);
}

Assistant:

bool mark_axis_bisection(CommPtr comm, Reals distances, Reals masses,
    Real total_mass, Real tolerance, Read<I8>& marked) {
  auto n = distances.size();
  OMEGA_H_CHECK(n == masses.size());
  auto minmax_dist = get_minmax(comm, distances);
  auto range = max2(std::abs(minmax_dist.min), std::abs(minmax_dist.max));
  auto step = range / 2.;
  Real distance = 0.;
  for (Int i = 0; i < MANTISSA_BITS; ++i) {
    marked = mark_half(distances, distance);
    auto half_weight = get_half_weight(comm, masses, marked);
    if (std::abs(half_weight - (total_mass / 2.)) <= tolerance) {
      return true;
    }
    if (half_weight > total_mass / 2.) {
      distance += step;
    } else {
      distance -= step;
    }
    step /= 2.;
  }
  return false;
}